

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_sequence_start_event_initialize
              (yaml_event_t *event,yaml_char_t *anchor,yaml_char_t *tag,int implicit,
              yaml_sequence_style_t style)

{
  int iVar1;
  size_t sVar2;
  yaml_char_t *__ptr;
  yaml_char_t *pyVar3;
  
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x373,
                  "int yaml_sequence_start_event_initialize(yaml_event_t *, yaml_char_t *, yaml_char_t *, int, yaml_sequence_style_t)"
                 );
  }
  if (anchor == (yaml_char_t *)0x0) {
    __ptr = (yaml_char_t *)0x0;
  }
  else {
    sVar2 = strlen((char *)anchor);
    iVar1 = yaml_check_utf8(anchor,sVar2);
    if ((iVar1 == 0) || (__ptr = (yaml_char_t *)strdup((char *)anchor), __ptr == (yaml_char_t *)0x0)
       ) {
      __ptr = (yaml_char_t *)0x0;
      goto LAB_001041cb;
    }
  }
  if (tag == (yaml_char_t *)0x0) {
    pyVar3 = (yaml_char_t *)0x0;
  }
  else {
    sVar2 = strlen((char *)tag);
    iVar1 = yaml_check_utf8(tag,sVar2);
    if ((iVar1 == 0) || (pyVar3 = (yaml_char_t *)strdup((char *)tag), pyVar3 == (yaml_char_t *)0x0))
    {
LAB_001041cb:
      free(__ptr);
      return 0;
    }
  }
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  event->type = YAML_SEQUENCE_START_EVENT;
  (event->start_mark).index = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->end_mark).column = 0;
  (event->data).scalar.anchor = __ptr;
  (event->data).scalar.tag = pyVar3;
  (event->data).sequence_start.implicit = implicit;
  (event->data).sequence_start.style = style;
  return 1;
}

Assistant:

YAML_DECLARE(int)
yaml_sequence_start_event_initialize(yaml_event_t *event,
        yaml_char_t *anchor, yaml_char_t *tag, int implicit,
        yaml_sequence_style_t style)
{
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *anchor_copy = NULL;
    yaml_char_t *tag_copy = NULL;

    assert(event);      /* Non-NULL event object is expected. */

    if (anchor) {
        if (!yaml_check_utf8(anchor, strlen((char *)anchor))) goto error;
        anchor_copy = yaml_strdup(anchor);
        if (!anchor_copy) goto error;
    }

    if (tag) {
        if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
        tag_copy = yaml_strdup(tag);
        if (!tag_copy) goto error;
    }

    SEQUENCE_START_EVENT_INIT(*event, anchor_copy, tag_copy,
            implicit, style, mark, mark);

    return 1;

error:
    yaml_free(anchor_copy);
    yaml_free(tag_copy);

    return 0;
}